

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Error * ot::commissioner::Interpreter::ParseChannelMask
                  (Error *__return_storage_ptr__,ChannelMask *aChannelMask,Expression *aExpr,
                  size_t aIndex)

{
  ErrorCode EVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  Error *pEVar6;
  char *begin;
  char *pcVar7;
  string *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  long lVar8;
  format_args args;
  ChannelMaskEntry entry;
  undefined1 local_88 [8];
  char *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  parse_func local_60 [1];
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  this = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  uVar5 = (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if ((uVar5 < aIndex) || (((int)uVar5 - (int)aIndex & 1U) != 0)) {
    local_88._0_4_ = none_type;
    local_80 = "too few arguments";
    local_78 = 0x11;
    local_70._M_allocated_capacity = 0;
    local_60[0] = (parse_func)0x0;
    pcVar7 = "too few arguments";
    local_70._8_8_ = (format_string_checker<char> *)local_88;
    while (begin = pcVar7, begin != "") {
      pcVar7 = begin + 1;
      if (*begin == '}') {
        if ((pcVar7 == "") || (*pcVar7 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar7 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_88);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_50,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    entry.mPage = '\x02';
    entry._1_3_ = 0;
    std::__cxx11::string::string((string *)&entry.mMasks,(string *)&local_50);
    Error::operator=(__return_storage_ptr__,(Error *)&entry);
    std::__cxx11::string::~string((string *)&entry.mMasks);
    this = &local_50;
  }
  else {
    lVar8 = aIndex << 5;
    uVar5 = aIndex - 2;
    do {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 2;
      if ((ulong)((long)(aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar5) {
        return __return_storage_ptr__;
      }
      entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      utils::ParseInteger<unsigned_char>
                ((Error *)local_88,&entry.mPage,
                 (string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar8));
      pEVar6 = Error::operator=(__return_storage_ptr__,(Error *)local_88);
      EVar1 = pEVar6->mCode;
      std::__cxx11::string::~string((string *)&local_80);
      bVar3 = true;
      if (EVar1 == kNone) {
        utils::Hex((Error *)local_88,&entry.mMasks,
                   (string *)
                   ((long)&(aExpr->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p + lVar8));
        pEVar6 = Error::operator=(__return_storage_ptr__,(Error *)local_88);
        EVar1 = pEVar6->mCode;
        std::__cxx11::string::~string((string *)&local_80);
        if (EVar1 != kNone) goto LAB_00129676;
        std::
        vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
        ::emplace_back<ot::commissioner::ChannelMaskEntry&>
                  ((vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
                    *)aChannelMask,&entry);
        bVar4 = true;
        bVar3 = false;
      }
      else {
LAB_00129676:
        bVar4 = false;
      }
      lVar8 = lVar8 + 0x40;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    } while (bVar4);
    if (bVar3) {
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::NetworkSelectionComparator::~NetworkSelectionComparator()
{
    if (mSuccess)
    {
        Network        nwk;
        RegistryStatus status = mInterpreter.mRegistry->GetCurrentNetwork(nwk);

        if (status == RegistryStatus::kSuccess && mStartWith != nwk.mXpan)
        {
            Console::Write(nwk.mXpan == 0 ? WARN_NETWORK_SELECTION_DROPPED : WARN_NETWORK_SELECTION_CHANGED,
                           Console::Color::kYellow);
        }
    }
}